

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckCVCIDCKeyRef(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaTypePtr pxVar1;
  xmlHashTablePtr pxVar2;
  xmlSchemaIDCMatcherPtr_conflict pxVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  bool bVar7;
  xmlChar *local_a8;
  xmlChar *strB_1;
  xmlChar *str_1;
  xmlChar *strB;
  xmlChar *str;
  xmlIDCHashEntryPtr_conflict e_1;
  xmlChar *value_1;
  xmlIDCHashEntryPtr_conflict e;
  xmlIDCHashEntryPtr_conflict r;
  xmlChar *value;
  xmlHashTablePtr table;
  xmlSchemaPSVIIDCNodePtr refNode;
  xmlSchemaPSVIIDCKeyPtr *keys;
  xmlSchemaPSVIIDCKeyPtr *refKeys;
  int hasDupls;
  int nbFields;
  int res;
  int k;
  int j;
  int i;
  xmlSchemaPSVIIDCBindingPtr_conflict bind;
  xmlSchemaIDCMatcherPtr_conflict matcher;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  bind = (xmlSchemaPSVIIDCBindingPtr_conflict)vctxt->inode->idcMatchers;
  matcher = (xmlSchemaIDCMatcherPtr_conflict)vctxt;
  do {
    if (bind == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
      return 0;
    }
    if (((*(int *)&bind->dupls == 0x18) && (bind[1].nodeTable != (xmlSchemaPSVIIDCNodePtr *)0x0)) &&
       (*(int *)(bind[1].nodeTable + 1) != 0)) {
      table = (xmlHashTablePtr)0x0;
      value = (xmlChar *)0x0;
      refKeys._4_4_ = *(int *)(*(long *)(*(long *)&bind->nbNodes + 8) + 0x40);
      for (_j = *(undefined8 **)(*(long *)&matcher[2].sizeKeySeqs + 0x60);
          (_j != (undefined8 *)0x0 &&
          (*(long *)(*(long *)(*(long *)(*(long *)&bind->nbNodes + 8) + 0x48) + 8) != _j[1]));
          _j = (undefined8 *)*_j) {
      }
      bVar7 = false;
      if ((_j != (undefined8 *)0x0) && (bVar7 = false, _j[4] != 0)) {
        bVar7 = *(int *)(_j[4] + 8) != 0;
      }
      refKeys._0_4_ = (uint)bVar7;
      if (_j != (undefined8 *)0x0) {
        value = (xmlChar *)xmlHashCreate(*(int *)(_j + 3) << 1);
        for (res = 0; res < *(int *)(_j + 3); res = res + 1) {
          refNode = *(xmlSchemaPSVIIDCNodePtr *)(*(long *)(_j[2] + (long)res * 8) + 8);
          xmlSchemaHashKeySequence
                    ((xmlSchemaValidCtxtPtr)matcher,(xmlChar **)&r,(xmlSchemaPSVIIDCKeyPtr *)refNode
                     ,refKeys._4_4_);
          value_1 = (xmlChar *)(*xmlMalloc)(0x10);
          if (value_1 == (xmlChar *)0x0) {
            xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)matcher);
          }
          else {
            *(int *)(value_1 + 8) = res;
            e = (xmlIDCHashEntryPtr_conflict)xmlHashLookup((xmlHashTablePtr)value,(xmlChar *)r);
            if (e == (xmlIDCHashEntryPtr_conflict)0x0) {
              value_1[0] = '\0';
              value_1[1] = '\0';
              value_1[2] = '\0';
              value_1[3] = '\0';
              value_1[4] = '\0';
              value_1[5] = '\0';
              value_1[6] = '\0';
              value_1[7] = '\0';
              iVar4 = xmlHashAddEntry((xmlHashTablePtr)value,(xmlChar *)r,value_1);
              if (iVar4 < 0) {
                xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)matcher);
                (*xmlFree)(value_1);
              }
            }
            else {
              *(xmlIDCHashEntryPtr *)value_1 = e->next;
              e->next = (xmlIDCHashEntryPtr)value_1;
            }
          }
          if (r != (xmlIDCHashEntryPtr_conflict)0x0) {
            (*xmlFree)(r);
            r = (xmlIDCHashEntryPtr_conflict)0x0;
          }
        }
      }
      for (k = 0; k < *(int *)(bind[1].nodeTable + 1); k = k + 1) {
        hasDupls = 0;
        table = (xmlHashTablePtr)(&(*bind[1].nodeTable)->node)[k];
        if (_j != (undefined8 *)0x0) {
          keys = *(xmlSchemaPSVIIDCKeyPtr **)&((xmlNodePtr)table)->type;
          xmlSchemaHashKeySequence
                    ((xmlSchemaValidCtxtPtr)matcher,(xmlChar **)&e_1,keys,refKeys._4_4_);
          str = (xmlChar *)xmlHashLookup((xmlHashTablePtr)value,(xmlChar *)e_1);
          if (e_1 != (xmlIDCHashEntryPtr_conflict)0x0) {
            (*xmlFree)(e_1);
            e_1 = (xmlIDCHashEntryPtr_conflict)0x0;
          }
          hasDupls = 0;
          for (; str != (xmlChar *)0x0; str = *(xmlChar **)str) {
            refNode = *(xmlSchemaPSVIIDCNodePtr *)
                       (*(long *)(_j[2] + (long)*(int *)(str + 8) * 8) + 8);
            nbFields = 0;
            while ((nbFields < refKeys._4_4_ &&
                   (hasDupls = xmlSchemaAreValuesEqual
                                         (*(xmlSchemaValPtr *)&(&refNode->node)[nbFields]->type,
                                          keys[nbFields]->val), hasDupls != 0))) {
              if (hasDupls == -1) {
                return -1;
              }
              nbFields = nbFields + 1;
            }
            if (hasDupls == 1) break;
          }
          if ((hasDupls == 0) && ((uint)refKeys != 0)) {
            for (res = 0; res < *(int *)(_j[4] + 8); res = res + 1) {
              refNode = *(xmlSchemaPSVIIDCNodePtr *)(*(long *)(*(long *)_j[4] + (long)res * 8) + 8);
              nbFields = 0;
              while ((nbFields < refKeys._4_4_ &&
                     (hasDupls = xmlSchemaAreValuesEqual
                                           (*(xmlSchemaValPtr *)&(&refNode->node)[nbFields]->type,
                                            keys[nbFields]->val), hasDupls != 0))) {
                if (hasDupls == -1) {
                  return -1;
                }
                nbFields = nbFields + 1;
              }
              pxVar3 = matcher;
              pxVar2 = table;
              if (hasDupls == 1) {
                strB = (xmlChar *)0x0;
                str_1 = (xmlChar *)0x0;
                pxVar1 = *(xmlSchemaTypePtr *)(*(long *)&bind->nbNodes + 8);
                pxVar5 = xmlSchemaFormatIDCKeySequence
                                   ((xmlSchemaValidCtxtPtr)matcher,&strB,
                                    *(xmlSchemaPSVIIDCKeyPtr **)&table->size,refKeys._4_4_);
                pxVar6 = xmlSchemaGetComponentQName(&str_1,*(void **)(*(long *)&bind->nbNodes + 8));
                xmlSchemaKeyrefErr((xmlSchemaValidCtxtPtr)pxVar3,XML_SCHEMAV_CVC_IDC,
                                   (xmlSchemaPSVIIDCNodePtr)pxVar2,pxVar1,
                                   "More than one match found for key-sequence %s of keyref \'%s\'",
                                   pxVar5,pxVar6);
                if (strB != (xmlChar *)0x0) {
                  (*xmlFree)(strB);
                  strB = (xmlChar *)0x0;
                }
                if (str_1 != (xmlChar *)0x0) {
                  (*xmlFree)(str_1);
                  str_1 = (xmlChar *)0x0;
                }
                break;
              }
            }
          }
        }
        pxVar3 = matcher;
        pxVar2 = table;
        if (hasDupls == 0) {
          strB_1 = (xmlChar *)0x0;
          local_a8 = (xmlChar *)0x0;
          pxVar1 = *(xmlSchemaTypePtr *)(*(long *)&bind->nbNodes + 8);
          pxVar5 = xmlSchemaFormatIDCKeySequence
                             ((xmlSchemaValidCtxtPtr)matcher,&strB_1,
                              *(xmlSchemaPSVIIDCKeyPtr **)&table->size,refKeys._4_4_);
          pxVar6 = xmlSchemaGetComponentQName(&local_a8,*(void **)(*(long *)&bind->nbNodes + 8));
          xmlSchemaKeyrefErr((xmlSchemaValidCtxtPtr)pxVar3,XML_SCHEMAV_CVC_IDC,
                             (xmlSchemaPSVIIDCNodePtr)pxVar2,pxVar1,
                             "No match found for key-sequence %s of keyref \'%s\'",pxVar5,pxVar6);
          if (strB_1 != (xmlChar *)0x0) {
            (*xmlFree)(strB_1);
            strB_1 = (xmlChar *)0x0;
          }
          if (local_a8 != (xmlChar *)0x0) {
            (*xmlFree)(local_a8);
            local_a8 = (xmlChar *)0x0;
          }
        }
      }
      if (value != (xmlChar *)0x0) {
        xmlHashFree((xmlHashTablePtr)value,xmlFreeIDCHashEntry);
      }
    }
    bind = (xmlSchemaPSVIIDCBindingPtr_conflict)bind->definition;
  } while( true );
}

Assistant:

static int
xmlSchemaCheckCVCIDCKeyRef(xmlSchemaValidCtxtPtr vctxt)
{
    xmlSchemaIDCMatcherPtr matcher;
    xmlSchemaPSVIIDCBindingPtr bind;

    matcher = vctxt->inode->idcMatchers;
    /*
    * Find a keyref.
    */
    while (matcher != NULL) {
	if ((matcher->idcType == XML_SCHEMA_TYPE_IDC_KEYREF) &&
	    matcher->targets &&
	    matcher->targets->nbItems)
	{
	    int i, j, k, res, nbFields, hasDupls;
	    xmlSchemaPSVIIDCKeyPtr *refKeys, *keys;
	    xmlSchemaPSVIIDCNodePtr refNode = NULL;
	    xmlHashTablePtr table = NULL;

	    nbFields = matcher->aidc->def->nbFields;

	    /*
	    * Find the IDC node-table for the referenced IDC key/unique.
	    */
	    bind = vctxt->inode->idcTable;
	    while (bind != NULL) {
		if ((xmlSchemaIDCPtr) matcher->aidc->def->ref->item ==
		    bind->definition)
		    break;
		bind = bind->next;
	    }
	    hasDupls = (bind && bind->dupls && bind->dupls->nbItems) ? 1 : 0;
	    /*
	    * Search for a matching key-sequences.
	    */
	    if (bind) {
		table = xmlHashCreate(bind->nbNodes * 2);
		for (j = 0; j < bind->nbNodes; j++) {
		    xmlChar *value;
		    xmlIDCHashEntryPtr r, e;
		    keys = bind->nodeTable[j]->keys;
		    xmlSchemaHashKeySequence(vctxt, &value, keys, nbFields);
		    e = xmlMalloc(sizeof *e);
                    if (e == NULL) {
                        xmlSchemaVErrMemory(vctxt);
                        goto mem_error;
                    }
		    e->index = j;
		    r = xmlHashLookup(table, value);
		    if (r) {
			e->next = r->next;
			r->next = e;
		    } else {
			e->next = NULL;
                        if (xmlHashAddEntry(table, value, e) < 0) {
                            xmlSchemaVErrMemory(vctxt);
                            xmlFree(e);
                        }
		    }
mem_error:
		    FREE_AND_NULL(value);
		}
	    }
	    for (i = 0; i < matcher->targets->nbItems; i++) {
		res = 0;
		refNode = matcher->targets->items[i];
		if (bind != NULL) {
		    xmlChar *value;
		    xmlIDCHashEntryPtr e;
		    refKeys = refNode->keys;
		    xmlSchemaHashKeySequence(vctxt, &value, refKeys, nbFields);
		    e = xmlHashLookup(table, value);
		    FREE_AND_NULL(value);
		    res = 0;
		    for (;e; e = e->next) {
			keys = bind->nodeTable[e->index]->keys;
			for (k = 0; k < nbFields; k++) {
			    res = xmlSchemaAreValuesEqual(keys[k]->val,
							  refKeys[k]->val);
			    if (res == 0)
			        break;
			    else if (res == -1) {
				return (-1);
			    }
			}
			if (res == 1) {
			    /*
			     * Match found.
			     */
			    break;
			}
		    }
		    if ((res == 0) && hasDupls) {
			/*
			* Search in duplicates
			*/
			for (j = 0; j < bind->dupls->nbItems; j++) {
			    keys = ((xmlSchemaPSVIIDCNodePtr)
				bind->dupls->items[j])->keys;
			    for (k = 0; k < nbFields; k++) {
				res = xmlSchemaAreValuesEqual(keys[k]->val,
				    refKeys[k]->val);
				if (res == 0)
				    break;
				else if (res == -1) {
				    return (-1);
				}
			    }
			    if (res == 1) {
				/*
				* Match in duplicates found.
				*/
				xmlChar *str = NULL, *strB = NULL;
				xmlSchemaKeyrefErr(vctxt,
				    XML_SCHEMAV_CVC_IDC, refNode,
				    (xmlSchemaTypePtr) matcher->aidc->def,
				    "More than one match found for "
				    "key-sequence %s of keyref '%s'",
				    xmlSchemaFormatIDCKeySequence(vctxt, &str,
					refNode->keys, nbFields),
				    xmlSchemaGetComponentQName(&strB,
					matcher->aidc->def));
				FREE_AND_NULL(str);
				FREE_AND_NULL(strB);
				break;
			    }
			}
		    }
		}

		if (res == 0) {
		    xmlChar *str = NULL, *strB = NULL;
		    xmlSchemaKeyrefErr(vctxt,
			XML_SCHEMAV_CVC_IDC, refNode,
			(xmlSchemaTypePtr) matcher->aidc->def,
			"No match found for key-sequence %s of keyref '%s'",
			xmlSchemaFormatIDCKeySequence(vctxt, &str,
			    refNode->keys, nbFields),
			xmlSchemaGetComponentQName(&strB, matcher->aidc->def));
		    FREE_AND_NULL(str);
		    FREE_AND_NULL(strB);
		}
	    }
	    if (table) {
		xmlHashFree(table, xmlFreeIDCHashEntry);
	    }
	}
	matcher = matcher->next;
    }
    /* TODO: Return an error if any error encountered. */
    return (0);
}